

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O3

void cursespp::SchemaOverlay::ShowStringOverlay
               (StringEntry *entry,PrefsPtr *prefs,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *callback)

{
  Type TVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  double value;
  uint __val;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  InputOverlay *pIVar7;
  _func_void *p_Var8;
  OverlayStack *this_00;
  runtime_error *this_01;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  uint __len;
  DoubleEntry *doubleEntry;
  bool allowEmptyValue;
  shared_ptr<cursespp::InputOverlay> dialog;
  string name;
  anon_class_80_3_1ce9ae6c handler;
  allocator<char> local_14a;
  allocator<char> local_149;
  string local_148;
  InputOverlay *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  long *local_118 [2];
  long local_108 [2];
  ILayoutPtr local_f8;
  long *local_e8 [2];
  long local_d8 [2];
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  string local_a0;
  element_type *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  _Any_data local_50;
  code *local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,(entry->entry).name,(allocator<char> *)&local_80);
  local_80 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_78 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_78->_M_use_count = local_78->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_78->_M_use_count = local_78->_M_use_count + 1;
    }
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_50,callback);
  pIVar7 = (InputOverlay *)operator_new(0x308);
  InputOverlay::InputOverlay(pIVar7);
  std::__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::InputOverlay,void>
            ((__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2> *)&local_128,pIVar7);
  pIVar7 = InputOverlay::SetTitle(local_128,&local_a0);
  peVar2 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
        goto LAB_001744cd;
      }
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    this->_M_use_count = this->_M_use_count + 1;
  }
LAB_001744cd:
  TVar1 = (entry->entry).type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,(entry->entry).name,&local_149);
  switch(TVar1) {
  case Bool:
    bVar4 = (**(code **)(*(long *)peVar2 + 0x50))
                      (peVar2,local_e8,*(undefined1 *)&entry->defaultValue);
    pcVar11 = "false";
    if (bVar4 != 0) {
      pcVar11 = "true";
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,pcVar11,pcVar11 + ((ulong)bVar4 ^ 5));
    break;
  case Int:
    uVar5 = (**(code **)(*(long *)peVar2 + 0x58))(peVar2,local_e8,entry[1].entry.type);
    __val = -uVar5;
    if (0 < (int)uVar5) {
      __val = uVar5;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_0017466a;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_0017466a;
        }
        if (uVar9 < 10000) goto LAB_0017466a;
        uVar10 = uVar10 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_0017466a:
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_148,(char)__len - (char)((int)uVar5 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_148._M_dataplus._M_p + (uVar5 >> 0x1f),__len,__val);
    break;
  case Double:
    iVar6 = *(int *)&entry[1].entry.name;
    value = (double)(**(code **)(*(long *)peVar2 + 0x60))
                              ((int)entry[1].defaultValue,peVar2,local_e8);
    stringValueForDouble_abi_cxx11_(&local_148,value,iVar6);
    break;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,entry->defaultValue,&local_14a);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_148,peVar2,local_e8,local_118);
    goto LAB_001745cc;
  case Enum:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,entry[1].entry.name,&local_14a);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_148,peVar2,local_e8,local_118);
LAB_001745cc:
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
    break;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"invalid type passed to stringValueFor!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  pIVar7 = InputOverlay::SetText(pIVar7,&local_148);
  iVar6 = Screen::GetWidth();
  pIVar7 = InputOverlay::SetWidth(pIVar7,(int)((float)iVar6 * 0.8));
  if (entry->defaultValue == (char *)0x0) {
    allowEmptyValue = false;
  }
  else {
    allowEmptyValue = *entry->defaultValue != '\0';
  }
  pIVar7 = InputOverlay::SetAllowEmptyValue(pIVar7,allowEmptyValue);
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  p_Var8 = (_func_void *)operator_new(0x50);
  *(element_type **)p_Var8 = local_80;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var8 + 8) = local_78;
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_78->_M_use_count = local_78->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_78->_M_use_count = local_78->_M_use_count + 1;
    }
  }
  *(_func_void **)(p_Var8 + 0x10) = p_Var8 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var8 + 0x10),local_70,local_68 + (long)local_70);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)(p_Var8 + 0x30),
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_50);
  pcStack_b0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:358:20)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:358:20)>
             ::_M_manager;
  local_c8._M_unused._M_function_pointer = p_Var8;
  InputOverlay::SetInputAcceptedCallback(pIVar7,(InputAcceptedCallback *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  this_00 = App::Overlays();
  local_f8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_128->super_OverlayBase).super_LayoutBase.super_ILayout;
  if (local_128 == (InputOverlay *)0x0) {
    local_f8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  local_f8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_120;
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_120->_M_use_count = local_120->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_120->_M_use_count = local_120->_M_use_count + 1;
    }
  }
  OverlayStack::Push(this_00,&local_f8);
  if (local_f8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SchemaOverlay::ShowStringOverlay(
    const ISchema::StringEntry* entry,
    PrefsPtr prefs,
    std::function<void(std::string)> callback)
{
    std::string name(entry->entry.name);

    auto handler = [prefs, name, callback](std::string value) {
        prefs->SetString(name, value.c_str());
        if (callback) { callback(value); }
    };

    std::shared_ptr<InputOverlay> dialog(new InputOverlay());

    dialog->SetTitle(name)
        .SetText(stringValueFor(prefs, entry))
        .SetWidth(overlayWidth())
        .SetAllowEmptyValue(entry->defaultValue && strlen(entry->defaultValue))
        .SetInputAcceptedCallback(handler);

    App::Overlays().Push(dialog);
}